

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::scan
               (FinalOptimizer *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  ArrayNewFixed *pAVar28;
  ulong uVar29;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::maybePushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pMVar25->size);
    goto LAB_00b605d0;
  case LoopId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00b601a9;
  case BreakId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::maybePushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pBVar16->condition);
    ppEVar4 = &pBVar16->value;
    goto LAB_00b600a3;
  case SwitchId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    goto LAB_00b600a3;
  case CallId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitCallIndirect,
               currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pCVar13->target);
    uVar29 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLocalSet,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00b60401;
  case GlobalGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitGlobalGet,currp)
    ;
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitGlobalSet,currp)
    ;
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00b601a9;
  case LoadId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00b605e8;
  case StoreId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00b603c8;
  case ConstId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00b60401;
  case BinaryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBinary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00b6036a;
  case SelectId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00b605c1;
  case DropId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00b6023a;
  case ReturnId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    goto LAB_00b600a3;
  case MemorySizeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemorySize,currp
              );
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryGrow,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00b6023a;
  case NopId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicRMW,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00b60448;
  case AtomicCmpxchgId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicCmpxchg,
               currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00b60439;
  case AtomicWaitId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicWait,currp
              );
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00b601c9;
  case AtomicNotifyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00b6036a;
  case AtomicFenceId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00b60401;
  case SIMDReplaceId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_00b60378;
  case SIMDShuffleId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00b605d0;
  case SIMDTernaryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00b601c9;
  case SIMDShiftId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDShift,currp)
    ;
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00b6036a;
  case SIMDLoadId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00b60304;
  case SIMDLoadStoreLaneId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00b603c8:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00b605e8;
  case MemoryInitId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryInit,currp
              );
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00b60439;
  case DataDropId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryCopy,currp
              );
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00b605c1;
  case MemoryFillId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitMemoryFill,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00b605c1;
  case PopId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefIsNull,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00b6023a;
  case RefFuncId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00b605d0;
  case TableGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableGet,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00b601a9:
    ppEVar4 = &pGVar8->value;
    goto LAB_00b605e8;
  case TableSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableSet,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00b60448;
  case TableSizeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableSize,currp)
    ;
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableGrow,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00b60448;
  case TableFillId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableFill,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00b60439;
  case TableCopyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableCopy,currp)
    ;
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00b605c1;
  case TableInitId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTableInit,currp)
    ;
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00b60439;
  case TryId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00b605e8;
  case TryTableId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTryTable,currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00b6023a;
  case ThrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitThrowRef,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00b6023a;
  case TupleMakeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTupleMake,currp)
    ;
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitTupleExtract,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00b6023a;
  case RefI31Id:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00b6023a;
  case I31GetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00b6023a;
  case CallRefId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pCVar9->target);
    uVar29 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefTest,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00b6023a;
  case RefCastId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefCast,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00b6023a;
  case BrOnId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00b60304:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00b605e8;
  case StructNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructNew,currp)
    ;
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructGet,currp)
    ;
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00b60401;
  case StructSetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructSet,currp)
    ;
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00b6036a;
  case StructRMWId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructRMW,currp)
    ;
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00b6036a;
  case StructCmpxchgId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStructCmpxchg,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00b601c9:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar5->timeout);
LAB_00b601e2:
    ppEVar4 = &pAVar5->expected;
    goto LAB_00b60378;
  case ArrayNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNew,currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar18->size);
    ppEVar4 = &pAVar18->init;
LAB_00b600a3:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::maybePushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNewData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00b60448;
  case ArrayNewElemId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNewElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00b60448;
  case ArrayNewFixedId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayNewFixed,
               currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)(uint)(pAVar28->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar28->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayGet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00b605d0;
  case ArraySetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArraySet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00b605c1;
  case ArrayLenId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayLen,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00b6023a;
  case ArrayCopyId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayCopy,currp)
    ;
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00b605b2;
  case ArrayFillId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayFill,currp)
    ;
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00b605b2:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00b605c1;
  case ArrayInitDataId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayInitData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00b5fd0f;
  case ArrayInitElemId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitArrayInitElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00b5fd0f:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               (Expression **)&pAVar12->memory);
LAB_00b60439:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar12->replacement);
LAB_00b60448:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00b605e8;
  case RefAsId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00b60401;
  case StringNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringNew,currp)
    ;
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::maybePushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar5->timeout);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::maybePushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar5->expected);
    goto LAB_00b60383;
  case StringConstId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringMeasure,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00b60401:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00b605e8;
  case StringEncodeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringEncode,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::maybePushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pAVar5->timeout);
    goto LAB_00b601e2;
  case StringConcatId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringConcat,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00b605d0;
  case StringEqId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringEq,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_00b6036a:
    ppEVar4 = &pAVar5->expected;
LAB_00b60378:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
LAB_00b60383:
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00b605e8;
  case StringWTF16GetId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringWTF16Get,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00b605d0;
  case StringSliceWTFId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStringSliceWTF,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00b605c1:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pMVar25->size);
LAB_00b605d0:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00b605e8;
  case ContNewId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitContNew,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00b6023a:
    ppEVar4 = &pTVar7->body;
LAB_00b605e8:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    return;
  case ContBindId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pCVar6->cont);
    uVar29 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitSuspend,currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pRVar2->cont);
    uVar29 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitResumeThrow,
               currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pRVar26->cont);
    uVar29 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,
               Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::doVisitStackSwitch,
               currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
              ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,
               &pSVar3->cont);
    uVar29 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::pushTask
                ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)self,scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }